

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int read_ADR(coda_cdf_product *product_file,int64_t offset)

{
  long lVar1;
  ushort uVar2;
  long lVar3;
  long offset_00;
  undefined2 uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  char cVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  char cVar16;
  char cVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  char cVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  char cVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  char cVar32;
  ushort uVar33;
  int iVar34;
  char *pcVar35;
  long offset_01;
  int32_t nz_entries;
  int32_t ngr_entries;
  int32_t num;
  int32_t scope;
  int64_t azedr_head;
  int64_t agredr_head;
  int32_t maxz_entry;
  int32_t maxgr_entry;
  int64_t adr_next;
  int32_t record_type;
  char name [257];
  undefined4 local_160;
  undefined4 local_15c;
  char local_158;
  undefined1 uStack_157;
  undefined2 uStack_156;
  undefined4 local_154;
  char local_150;
  undefined1 uStack_14f;
  undefined1 uStack_14e;
  undefined1 uStack_14d;
  undefined1 uStack_14c;
  undefined1 uStack_14b;
  undefined1 uStack_14a;
  char cStack_149;
  char local_148;
  undefined1 uStack_147;
  undefined1 uStack_146;
  undefined1 uStack_145;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined1 uStack_142;
  char cStack_141;
  undefined1 local_140;
  undefined1 local_13f;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  undefined1 local_13a;
  undefined1 local_139;
  char local_138;
  ushort uStack_137;
  undefined1 uStack_135;
  undefined1 uStack_134;
  ushort uStack_133;
  char cStack_131;
  undefined4 local_12c;
  char local_128 [256];
  undefined1 local_28;
  
  if (offset == 0) {
    return 0;
  }
  iVar34 = read_bytes(product_file->raw_product,offset + 8,4,&local_12c);
  if (iVar34 < 0) {
    return -1;
  }
  uVar10 = (undefined1)local_12c;
  uVar33 = local_12c._1_2_ << 8;
  uVar2 = local_12c._1_2_ >> 8;
  local_12c = CONCAT13(uVar10,CONCAT21(uVar33 | uVar2,local_12c._3_1_));
  if (local_12c == 4) {
    iVar34 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_138);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x14,8,&local_148);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x1c,4,&local_154);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x20,4,&local_158);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x24,4,&local_15c);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x28,4,&local_13c);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x30,8,&local_150);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x38,4,&local_160);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x3c,4,&local_140);
    if (iVar34 < 0) {
      return -1;
    }
    iVar34 = read_bytes(product_file->raw_product,offset + 0x44,0x100,local_128);
    if (iVar34 < 0) {
      return -1;
    }
    local_28 = 0;
    rtrim(local_128);
    cVar32 = cStack_131;
    uVar31 = uStack_134;
    uVar30 = uStack_135;
    cVar29 = local_138;
    uVar28 = local_139;
    uVar27 = local_13a;
    uVar26 = local_13d;
    uVar25 = local_13e;
    cVar24 = cStack_141;
    uVar23 = uStack_142;
    uVar22 = uStack_143;
    uVar21 = uStack_144;
    uVar20 = uStack_145;
    uVar19 = uStack_146;
    uVar18 = uStack_147;
    cVar17 = local_148;
    cVar16 = cStack_149;
    uVar15 = uStack_14a;
    uVar14 = uStack_14b;
    uVar13 = uStack_14c;
    uVar12 = uStack_14d;
    uVar11 = uStack_14e;
    uVar10 = uStack_14f;
    cVar9 = local_150;
    uVar8 = local_154;
    cStack_131 = local_138;
    local_138 = cVar32;
    uVar33 = uStack_137 << 8 | uStack_137 >> 8;
    uStack_137 = uStack_133 << 8 | uStack_133 >> 8;
    uStack_134 = uStack_135;
    uStack_135 = uVar31;
    cStack_141 = local_148;
    local_148 = cVar24;
    uStack_142 = uStack_147;
    uStack_147 = uVar23;
    uStack_143 = uStack_146;
    uStack_146 = uVar22;
    uStack_144 = uStack_145;
    uStack_145 = uVar21;
    uVar4 = CONCAT11((undefined1)local_154,local_154._1_1_);
    local_154 = CONCAT22(uVar4,CONCAT11(local_154._2_1_,local_154._3_1_));
    cVar7 = local_158;
    uVar4 = CONCAT11(local_158,uStack_157);
    _local_158 = CONCAT22(uVar4,CONCAT11((undefined1)uStack_156,uStack_156._1_1_));
    cVar6 = (char)local_15c;
    uVar4 = CONCAT11((char)local_15c,local_15c._1_1_);
    local_15c = CONCAT22(uVar4,CONCAT11(local_15c._2_1_,local_15c._3_1_));
    local_139 = local_13c;
    local_13c = uVar28;
    local_13a = local_13b;
    local_13b = uVar27;
    cStack_149 = local_150;
    local_150 = cVar16;
    uStack_14a = uStack_14f;
    uStack_14f = uVar15;
    uStack_14b = uStack_14e;
    uStack_14e = uVar14;
    uStack_14c = uStack_14d;
    uStack_14d = uVar13;
    cVar5 = (char)local_160;
    uVar4 = CONCAT11((char)local_160,local_160._1_1_);
    local_160 = CONCAT22(uVar4,CONCAT11(local_160._2_1_,local_160._3_1_));
    local_13d = local_140;
    local_140 = uVar26;
    local_13e = local_13f;
    local_13f = uVar25;
    offset_00 = CONCAT17(cVar29,CONCAT25(uVar33,CONCAT14(uVar30,CONCAT13(uVar31,CONCAT21(uStack_137,
                                                                                         cVar32)))))
    ;
    uStack_133 = uVar33;
    if ((cVar29 < '\0') || (lVar1 = product_file->file_size, lVar1 <= offset_00)) {
      pcVar35 = "CDF file has invalid offset for ADR record";
    }
    else {
      offset_01 = CONCAT17(cVar17,CONCAT16(uVar18,CONCAT15(uVar19,CONCAT14(uVar20,CONCAT13(uVar21,
                                                  CONCAT12(uVar22,CONCAT11(uVar23,cVar24)))))));
      if (cVar17 < '\0' || lVar1 <= offset_01) {
        pcVar35 = "CDF file has invalid offset for AgrEDR record";
      }
      else if (cVar7 < '\0') {
        pcVar35 = "CDF file has invalid attribute number in ADR record";
      }
      else if (cVar6 < '\0') {
        pcVar35 = "CDF file has invalid number of g/rEntries in ADR record";
      }
      else {
        lVar3 = CONCAT17(cVar9,CONCAT16(uVar10,CONCAT15(uVar11,CONCAT14(uVar12,CONCAT13(uVar13,
                                                  CONCAT12(uVar14,CONCAT11(uVar15,cVar16)))))));
        if (cVar9 < '\0' || lVar1 <= lVar3) {
          pcVar35 = "CDF file has invalid offset for AzEDR record";
        }
        else {
          if (-1 < cVar5) {
            if ((uVar8 & 0x1000000) == 0) {
              if (local_15c == 0) {
                offset_01 = lVar3;
              }
LAB_00158ca1:
              iVar34 = read_AEDR(product_file,offset_01,local_128,local_154);
              if (iVar34 != 0) {
                return -1;
              }
              iVar34 = read_ADR(product_file,offset_00);
              return -(uint)(iVar34 != 0);
            }
            if (local_160 == 0) goto LAB_00158ca1;
            pcVar35 = "gADR record has non-zero NzEntries (%d)";
            goto LAB_00158c37;
          }
          pcVar35 = "CDF file has invalid number of zEntries in ADR record";
        }
      }
    }
    coda_set_error(-300,pcVar35);
  }
  else {
    pcVar35 = "CDF file has invalid record type (%d) for ADR record";
LAB_00158c37:
    coda_set_error(-300,pcVar35);
  }
  return -1;
}

Assistant:

static int read_ADR(coda_cdf_product *product_file, int64_t offset)
{
    int32_t record_type;
    int64_t adr_next;
    int64_t agredr_head;
    int32_t scope;
    int32_t num;
    int32_t ngr_entries;
    int32_t maxgr_entry;
    int64_t azedr_head;
    int32_t nz_entries;
    int32_t maxz_entry;
    int64_t aedr_head;
    char name[257];

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 4)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for ADR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &adr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 8, &agredr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 4, &scope) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 32, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 36, 4, &ngr_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 40, 4, &maxgr_entry) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 48, 8, &azedr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 56, 4, &nz_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 60, 4, &maxz_entry) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 68, 256, name) < 0)
    {
        return -1;
    }
    name[256] = '\0';
    rtrim(name);
#ifndef WORDS_BIGENDIAN
    swap_int64(&adr_next);
    swap_int64(&agredr_head);
    swap_int32(&scope);
    swap_int32(&num);
    swap_int32(&ngr_entries);
    swap_int32(&maxgr_entry);
    swap_int64(&azedr_head);
    swap_int32(&nz_entries);
    swap_int32(&maxz_entry);
#endif
    if (adr_next < 0 || adr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for ADR record");
        return -1;
    }
    if (agredr_head < 0 || agredr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AgrEDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid attribute number in ADR record");
        return -1;
    }
    if (ngr_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of g/rEntries in ADR record");
        return -1;
    }
    if (azedr_head < 0 || azedr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AzEDR record");
        return -1;
    }
    if (nz_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of zEntries in ADR record");
        return -1;
    }

    aedr_head = agredr_head;
    if (scope & 1)
    {
        if (nz_entries != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "gADR record has non-zero NzEntries (%d)", nz_entries);
            return -1;
        }
    }
    else if (ngr_entries == 0)
    {
        aedr_head = azedr_head;
    }

    if (read_AEDR(product_file, aedr_head, name, scope) != 0)
    {
        return -1;
    }

    if (read_ADR(product_file, adr_next) != 0)
    {
        return -1;
    }

    return 0;
}